

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general_names_unittest.cc
# Opt level: O2

void __thiscall bssl::GeneralNames_DnsName_Test::TestBody(GeneralNames_DnsName_Test *this)

{
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char *pcVar1;
  char *in_R9;
  Input general_names_tlv;
  AssertHelper local_90;
  unique_ptr<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_> general_names;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar;
  AssertHelper local_50;
  CertErrors errors;
  string san_der;
  
  san_der._M_dataplus._M_p = (pointer)&san_der.field_2;
  san_der._M_string_length = 0;
  san_der.field_2._M_local_buf[0] = '\0';
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"san-dnsname.pem",(allocator<char> *)&gtest_ar__1);
  anon_unknown_20::LoadTestSubjectAltNameData
            ((anon_unknown_20 *)&errors,(string *)&gtest_ar,&san_der);
  ::std::__cxx11::string::~string((string *)&gtest_ar);
  if ((char)errors.nodes_.super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>.
            _M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&gtest_ar__1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&errors,
               (AssertionResult *)"LoadTestSubjectAltNameData(\"san-dnsname.pem\", &san_der)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&general_names,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/general_names_unittest.cc"
               ,99,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&general_names,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&general_names);
    ::std::__cxx11::string::~string((string *)&gtest_ar);
    if (gtest_ar__1._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__1._0_8_ + 8))();
    }
    ::std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&errors.nodes_.
                      super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  }
  else {
    ::std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&errors.nodes_.
                      super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>._M_impl.
                      super__Vector_impl_data._M_finish);
    CertErrors::CertErrors(&errors);
    general_names_tlv.data_.size_ = (size_t)san_der._M_dataplus._M_p;
    general_names_tlv.data_.data_ = (uchar *)&general_names;
    GeneralNames::Create(general_names_tlv,(CertErrors *)san_der._M_string_length);
    this_00 = &gtest_ar__1.message_;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar__1.success_ =
         (__uniq_ptr_impl<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>)
         general_names._M_t.
         super___uniq_ptr_impl<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>._M_t.
         super__Tuple_impl<0UL,_bssl::GeneralNames_*,_std::default_delete<bssl::GeneralNames>_>.
         super__Head_base<0UL,_bssl::GeneralNames_*,_false>._M_head_impl !=
         (__uniq_ptr_impl<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>)0x0;
    if ((__uniq_ptr_impl<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>)
        general_names._M_t.
        super___uniq_ptr_impl<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>._M_t.
        super__Tuple_impl<0UL,_bssl::GeneralNames_*,_std::default_delete<bssl::GeneralNames>_>.
        super__Head_base<0UL,_bssl::GeneralNames_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>)0x0) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar__1,(AssertionResult *)"general_names",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/general_names_unittest.cc"
                 ,0x68,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      ::std::__cxx11::string::~string((string *)&gtest_ar);
      if ((long *)CONCAT44(local_90.data_._4_4_,local_90.data_._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_90.data_._4_4_,local_90.data_._0_4_) + 8))();
      }
    }
    else {
      ::std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(this_00);
      gtest_ar__1._0_4_ = 4;
      testing::internal::CmpHelperEQ<bssl::GeneralNameTypes,int>
                ((internal *)&gtest_ar,"GENERAL_NAME_DNS_NAME","general_names->present_name_types",
                 (GeneralNameTypes *)&gtest_ar__1,
                 (int *)((long)general_names._M_t.
                               super___uniq_ptr_impl<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_bssl::GeneralNames_*,_std::default_delete<bssl::GeneralNames>_>
                               .super__Head_base<0UL,_bssl::GeneralNames_*,_false>._M_head_impl +
                        0xf0));
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar__1);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar1 = "";
        }
        else {
          pcVar1 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/general_names_unittest.cc"
                   ,0x69,pcVar1);
        testing::internal::AssertHelper::operator=(&local_90,(Message *)&gtest_ar__1);
        testing::internal::AssertHelper::~AssertHelper(&local_90);
        if (gtest_ar__1._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar__1._0_8_ + 8))();
        }
      }
      ::std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      local_90.data_._0_4_ = 1;
      gtest_ar__1._0_8_ =
           *(long *)((long)general_names._M_t.
                           super___uniq_ptr_impl<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_bssl::GeneralNames_*,_std::default_delete<bssl::GeneralNames>_>
                           .super__Head_base<0UL,_bssl::GeneralNames_*,_false>._M_head_impl + 0x38)
           - *(long *)((long)general_names._M_t.
                             super___uniq_ptr_impl<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_bssl::GeneralNames_*,_std::default_delete<bssl::GeneralNames>_>
                             .super__Head_base<0UL,_bssl::GeneralNames_*,_false>._M_head_impl + 0x30
                      ) >> 4;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                ((internal *)&gtest_ar,"1U","general_names->dns_names.size()",(uint *)&local_90,
                 (unsigned_long *)&gtest_ar__1);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar__1);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar1 = "";
        }
        else {
          pcVar1 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/general_names_unittest.cc"
                   ,0x6a,pcVar1);
        testing::internal::AssertHelper::operator=(&local_90,(Message *)&gtest_ar__1);
        this_00 = &gtest_ar.message_;
        testing::internal::AssertHelper::~AssertHelper(&local_90);
        if (gtest_ar__1._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar__1._0_8_ + 8))();
        }
      }
      else {
        ::std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        testing::internal::CmpHelperEQ<char[16],std::basic_string_view<char,std::char_traits<char>>>
                  ((internal *)&gtest_ar,"\"foo.example.com\"","general_names->dns_names[0]",
                   (char (*) [16])"foo.example.com",
                   *(basic_string_view<char,_std::char_traits<char>_> **)
                    ((long)general_names._M_t.
                           super___uniq_ptr_impl<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_bssl::GeneralNames_*,_std::default_delete<bssl::GeneralNames>_>
                           .super__Head_base<0UL,_bssl::GeneralNames_*,_false>._M_head_impl + 0x30))
        ;
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar__1);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar1 = "";
          }
          else {
            pcVar1 = *(char **)gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_90,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/general_names_unittest.cc"
                     ,0x6b,pcVar1);
          testing::internal::AssertHelper::operator=(&local_90,(Message *)&gtest_ar__1);
          testing::internal::AssertHelper::~AssertHelper(&local_90);
          if (gtest_ar__1._0_8_ != 0) {
            (**(code **)(*(long *)gtest_ar__1._0_8_ + 8))();
          }
        }
        this_00 = &gtest_ar.message_;
      }
    }
    ::std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(this_00);
    ::std::unique_ptr<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>::~unique_ptr
              (&general_names);
    CertErrors::~CertErrors(&errors);
  }
  ::std::__cxx11::string::~string((string *)&san_der);
  return;
}

Assistant:

TEST(GeneralNames, IPAddress_v6) {
  std::string san_der;
  ASSERT_TRUE(LoadTestSubjectAltNameData("san-ipaddress6.pem", &san_der));

  CertErrors errors;
  std::unique_ptr<GeneralNames> general_names =
      GeneralNames::Create(StringAsBytes(san_der), &errors);
  ASSERT_TRUE(general_names);
  EXPECT_EQ(GENERAL_NAME_IP_ADDRESS, general_names->present_name_types);
  ASSERT_EQ(1U, general_names->ip_addresses.size());
  static const uint8_t kIP[] = {0xFE, 0x80, 1, 2,  3,  4,  5,  6,
                                7,    8,    9, 10, 11, 12, 13, 14};
  EXPECT_EQ(der::Input(kIP), general_names->ip_addresses[0]);
  EXPECT_EQ(0U, general_names->ip_address_ranges.size());
}